

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file-server.cpp
# Opt level: O2

bool __thiscall GGSock::FileServer::clearAllFiles(FileServer *this)

{
  pointer pFVar1;
  int i;
  size_type __n;
  _Head_base<0UL,_GGSock::FileServer::Impl_*,_false> _Var2;
  FileData *this_00;
  reference rVar3;
  allocator local_a9;
  pthread_mutex_t *local_a8;
  FileServer *local_a0;
  undefined1 local_98 [72];
  int32_t local_50;
  pointer local_48;
  pointer pcStack_40;
  pointer local_38;
  
  local_a8 = (pthread_mutex_t *)
             &((this->m_impl)._M_t.
               super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
               ._M_t.
               super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
               .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->mutex;
  std::mutex::lock((mutex *)&local_a8->__data);
  _Var2._M_head_impl =
       (this->m_impl)._M_t.
       super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
       ._M_t.
       super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
       .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
  (_Var2._M_head_impl)->currentFileUpdateId = 0;
  local_a0 = this;
  for (__n = 0; (long)__n <
                (long)(int)((*(int *)&(((_Bit_iterator *)
                                       ((long)&((_Var2._M_head_impl)->fileUsed).
                                               super__Bvector_base<std::allocator<bool>_> + 0x10))->
                                      super__Bit_iterator_base)._M_p -
                            *(int *)&((_Var2._M_head_impl)->fileUsed).
                                     super__Bvector_base<std::allocator<bool>_>._M_impl) * 8 +
                           *(uint *)((long)&((_Var2._M_head_impl)->fileUsed).
                                            super__Bvector_base<std::allocator<bool>_> + 0x18));
      __n = __n + 1) {
    rVar3 = std::vector<bool,_std::allocator<bool>_>::operator[]
                      (&(_Var2._M_head_impl)->fileUsed,__n);
    *rVar3._M_p = *rVar3._M_p & ~rVar3._M_mask;
    _Var2._M_head_impl =
         (local_a0->m_impl)._M_t.
         super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>
         ._M_t.
         super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
         .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl;
  }
  pFVar1 = *(pointer *)
            ((long)&((_Var2._M_head_impl)->files).
                    super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
            + 8);
  for (this_00 = *(FileData **)
                  &((_Var2._M_head_impl)->files).
                   super__Vector_base<GGSock::FileServer::FileData,_std::allocator<GGSock::FileServer::FileData>_>
                   ._M_impl; this_00 != pFVar1; this_00 = this_00 + 1) {
    std::__cxx11::string::string((string *)local_98,"?",&local_a9);
    local_98._32_8_ = 0;
    std::__cxx11::string::string((string *)(local_98 + 0x28),"?",&local_a9);
    local_50 = 0;
    local_48 = (pointer)0x0;
    pcStack_40 = (pointer)0x0;
    local_38 = (pointer)0x0;
    FileData::operator=(this_00,(FileData *)local_98);
    FileData::~FileData((FileData *)local_98);
  }
  ((local_a0->m_impl)._M_t.
   super___uniq_ptr_impl<GGSock::FileServer::Impl,_std::default_delete<GGSock::FileServer::Impl>_>.
   _M_t.
   super__Tuple_impl<0UL,_GGSock::FileServer::Impl_*,_std::default_delete<GGSock::FileServer::Impl>_>
   .super__Head_base<0UL,_GGSock::FileServer::Impl_*,_false>._M_head_impl)->changedFileInfos = true;
  pthread_mutex_unlock(local_a8);
  return true;
}

Assistant:

bool FileServer::clearAllFiles() {
    {
        std::lock_guard<std::mutex> lock(m_impl->mutex);

        m_impl->currentFileUpdateId = 0;
        for (int i = 0; i < (int) m_impl->fileUsed.size(); ++i) {
            m_impl->fileUsed[i] = false;
        }

        for (auto & file : m_impl->files) {
            file = {};
        }

        m_impl->changedFileInfos = true;
    }

    return true;
}